

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O2

void __thiscall
defyx::AssemblyGeneratorX86::h_IROL_R(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  byte bVar1;
  ostream *poVar2;
  undefined1 *puVar3;
  
  bVar1 = instr->dst;
  this->registerUsage[bVar1] = i;
  puVar3 = &this->field_0x10;
  if (instr->src == bVar1) {
    poVar2 = std::operator<<((ostream *)puVar3,"\trol ");
    poVar2 = std::operator<<(poVar2,*(char **)(regR + (ulong)instr->dst * 8));
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  else {
    poVar2 = std::operator<<((ostream *)puVar3,"\tmov ecx, ");
    poVar2 = std::operator<<(poVar2,*(char **)(regR32 + (ulong)instr->src * 8));
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)puVar3,"\trol ");
    poVar2 = std::operator<<(poVar2,*(char **)(regR + (ulong)instr->dst * 8));
    poVar2 = std::operator<<(poVar2,", cl");
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void AssemblyGeneratorX86::h_IROL_R(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if (instr.src != instr.dst) {
			asmCode << "\tmov ecx, " << regR32[instr.src] << std::endl;
			asmCode << "\trol " << regR[instr.dst] << ", cl" << std::endl;
		}
		else {
			asmCode << "\trol " << regR[instr.dst] << ", " << (instr.getImm32() & 63) << std::endl;
		}
		traceint(instr);
	}